

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O0

int AnalyzeMTMessage(uchar *buf,int buflen,int addr,int mid)

{
  int iVar1;
  int msglen;
  int mid_local;
  int addr_local;
  int buflen_local;
  uchar *buf_local;
  
  if (buflen < 5) {
    buf_local._4_4_ = 1;
  }
  else if (*buf == 0xfa) {
    if ((uint)buf[1] == (addr & 0xffU)) {
      if ((uint)buf[2] == (mid & 0xffU)) {
        if ((buf[3] == 0xff) && (buflen < 7)) {
          buf_local._4_4_ = 1;
        }
        else {
          iVar1 = GetLengthMTMessage(buf);
          if (buflen < iVar1) {
            buf_local._4_4_ = 1;
          }
          else {
            iVar1 = CheckMTChecksum(buf,iVar1);
            if (iVar1 == 0) {
              buf_local._4_4_ = 0;
            }
            else {
              buf_local._4_4_ = 1;
            }
          }
        }
      }
      else {
        buf_local._4_4_ = 1;
      }
    }
    else {
      buf_local._4_4_ = 1;
    }
  }
  else {
    buf_local._4_4_ = 1;
  }
  return buf_local._4_4_;
}

Assistant:

inline int AnalyzeMTMessage(unsigned char* buf, int buflen, int addr, int mid)
{
	int msglen = 0;

	// Check number of bytes.
	if (buflen < MIN_STANDARD_BUF_LEN_MT)
	{
		//printf("Invalid number of bytes.\n");
		return EXIT_FAILURE;
	}
	// Check preamble.
	if (buf[0] != PREAMBLE_MT)
	{
		//printf("Invalid preamble.\n");
		return EXIT_FAILURE;
	}
	// Check device address.
	if (buf[1] != (unsigned char)addr)
	{
		//printf("Invalid device address.\n");
		return EXIT_FAILURE;
	}
	// Check message identifier.
	if (buf[2] != (unsigned char)mid)
	{
		//printf("Invalid message identifier.\n");
		return EXIT_FAILURE;
	}
	// Check number of data bytes.
	if (buf[3] == EXT_LEN_MT)
	{
		if (buflen < MIN_EXTENDED_BUF_LEN_MT)
		{
			//printf("Invalid number of bytes.\n");
			return EXIT_FAILURE;
		}
	}
	msglen = GetLengthMTMessage(buf);	
	if (buflen < msglen)
	{
		//printf("Incomplete message.\n");
		return EXIT_FAILURE;
	}
	// Checksum.
	if (CheckMTChecksum(buf, msglen) != EXIT_SUCCESS)
	{ 
		//printf("Invalid checksum.\n");
		return EXIT_FAILURE;	
	}

	return EXIT_SUCCESS;
}